

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_threading.hpp
# Opt level: O2

unordered_map<const_void_*,_chaiscript::detail::Stack_Holder,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>_>
* chaiscript::detail::threading::Thread_Storage<chaiscript::detail::Stack_Holder>::t(void)

{
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-0x11] == '\0') {
    in_FS_OFFSET[-0x18] = *in_FS_OFFSET + -0x90;
    in_FS_OFFSET[-0x17] = 1;
    in_FS_OFFSET[-0x16] = 0;
    in_FS_OFFSET[-0x15] = 0;
    *(undefined4 *)(in_FS_OFFSET + -0x14) = 0x3f800000;
    in_FS_OFFSET[-0x13] = 0;
    in_FS_OFFSET[-0x12] = 0;
    __cxa_thread_atexit(std::
                        unordered_map<const_void_*,_chaiscript::detail::Stack_Holder,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>_>
                        ::~unordered_map,*in_FS_OFFSET + -0xc0,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -0x11) = 1;
  }
  return (unordered_map<const_void_*,_chaiscript::detail::Stack_Holder,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>_>
          *)(*in_FS_OFFSET + -0xc0);
}

Assistant:

static std::unordered_map<const void *, T> &t() noexcept {
      static thread_local std::unordered_map<const void *, T> my_t;
      return my_t;
    }